

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine_cache.cpp
# Opt level: O1

void __thiscall duckdb::CSVStateMachineCache::CSVStateMachineCache(CSVStateMachineCache *this)

{
  bool strict_mode_p;
  reference pvVar1;
  long lVar2;
  byte *pbVar3;
  vector<char,_true> default_comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  default_delimiter;
  vector<duckdb::QuoteRule,_true> default_quote_rule;
  vector<duckdb::vector<char,_true>,_true> default_quote;
  vector<duckdb::vector<char,_true>,_true> default_escape;
  undefined2 local_1a2;
  char *local_1a0;
  long *local_198;
  char *local_190;
  char *local_188;
  CSVStateMachineCache *local_180;
  byte *local_178;
  byte *local_170;
  char *local_168;
  long *local_160;
  ulong local_158;
  char *local_150;
  char *local_148;
  long local_140;
  CSVStateMachineOptions local_138;
  string local_100;
  string local_e0;
  string local_c0;
  char *local_a0;
  char *local_98;
  long *local_88;
  long *local_80;
  byte *local_70;
  byte *local_68;
  vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_> local_58;
  vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_> local_40;
  
  (this->super_ObjectCacheEntry)._vptr_ObjectCacheEntry =
       (_func_int **)&PTR__CSVStateMachineCache_024a9738;
  (this->state_machine_cache)._M_h._M_buckets = &(this->state_machine_cache)._M_h._M_single_bucket;
  (this->state_machine_cache)._M_h._M_bucket_count = 1;
  (this->state_machine_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->state_machine_cache)._M_h._M_element_count = 0;
  (this->state_machine_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->state_machine_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->state_machine_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->main_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_180 = this;
  DialectCandidates::GetDefaultQuote();
  DialectCandidates::GetDefaultEscape();
  DialectCandidates::GetDefaultQuoteRule();
  DialectCandidates::GetDefaultDelimiter_abi_cxx11_();
  DialectCandidates::GetDefaultComment();
  local_178 = local_68;
  if (local_70 != local_68) {
    pbVar3 = local_70;
    do {
      local_158 = (ulong)*pbVar3;
      local_170 = pbVar3;
      pvVar1 = vector<duckdb::vector<char,_true>,_true>::operator[]
                         ((vector<duckdb::vector<char,_true>,_true> *)&local_58,local_158);
      local_1a0 = (pvVar1->super_vector<char,_std::allocator<char>_>).
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_start;
      local_168 = (pvVar1->super_vector<char,_std::allocator<char>_>).
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_finish;
      if (local_1a0 != local_168) {
        do {
          local_198 = local_88;
          local_160 = local_80;
          if (local_88 != local_80) {
            do {
              pvVar1 = vector<duckdb::vector<char,_true>,_true>::operator[]
                                 ((vector<duckdb::vector<char,_true>,_true> *)&local_40,local_158);
              local_190 = (pvVar1->super_vector<char,_std::allocator<char>_>).
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
              local_150 = (pvVar1->super_vector<char,_std::allocator<char>_>).
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              if (local_190 != local_150) {
                do {
                  local_188 = local_a0;
                  local_148 = local_98;
                  if (local_a0 != local_98) {
                    do {
                      local_1a2 = 1;
                      lVar2 = 0;
                      do {
                        local_140 = lVar2;
                        strict_mode_p = *(bool *)((long)&local_1a2 + lVar2);
                        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_c0,*local_198,local_198[1] + *local_198);
                        CSVStateMachineOptions::CSVStateMachineOptions
                                  (&local_138,&local_c0,*local_1a0,*local_190,*local_188,SINGLE_N,
                                   strict_mode_p);
                        Insert(local_180,&local_138);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.delimiter.value._M_dataplus._M_p !=
                            &local_138.delimiter.value.field_2) {
                          operator_delete(local_138.delimiter.value._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                          operator_delete(local_c0._M_dataplus._M_p);
                        }
                        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_e0,*local_198,local_198[1] + *local_198);
                        CSVStateMachineOptions::CSVStateMachineOptions
                                  (&local_138,&local_e0,*local_1a0,*local_190,*local_188,SINGLE_R,
                                   strict_mode_p);
                        Insert(local_180,&local_138);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.delimiter.value._M_dataplus._M_p !=
                            &local_138.delimiter.value.field_2) {
                          operator_delete(local_138.delimiter.value._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                          operator_delete(local_e0._M_dataplus._M_p);
                        }
                        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_100,*local_198,local_198[1] + *local_198);
                        CSVStateMachineOptions::CSVStateMachineOptions
                                  (&local_138,&local_100,*local_1a0,*local_190,*local_188,CARRY_ON,
                                   strict_mode_p);
                        Insert(local_180,&local_138);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.delimiter.value._M_dataplus._M_p !=
                            &local_138.delimiter.value.field_2) {
                          operator_delete(local_138.delimiter.value._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_100._M_dataplus._M_p != &local_100.field_2) {
                          operator_delete(local_100._M_dataplus._M_p);
                        }
                        lVar2 = local_140 + 1;
                      } while (lVar2 != 2);
                      local_188 = local_188 + 1;
                    } while (local_188 != local_148);
                  }
                  local_190 = local_190 + 1;
                } while (local_190 != local_150);
              }
              local_198 = local_198 + 4;
            } while (local_198 != local_160);
          }
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 != local_168);
      }
      pbVar3 = local_170 + 1;
    } while (pbVar3 != local_178);
  }
  if (local_a0 != (char *)0x0) {
    operator_delete(local_a0);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  if (local_70 != (byte *)0x0) {
    operator_delete(local_70);
  }
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::~vector
            (&local_40);
  ::std::vector<duckdb::vector<char,_true>,_std::allocator<duckdb::vector<char,_true>_>_>::~vector
            (&local_58);
  return;
}

Assistant:

CSVStateMachineCache::CSVStateMachineCache() {
	auto default_quote = DialectCandidates::GetDefaultQuote();
	auto default_escape = DialectCandidates::GetDefaultEscape();
	auto default_quote_rule = DialectCandidates::GetDefaultQuoteRule();
	auto default_delimiter = DialectCandidates::GetDefaultDelimiter();
	auto default_comment = DialectCandidates::GetDefaultComment();

	for (auto quote_rule : default_quote_rule) {
		const auto &quote_candidates = default_quote[static_cast<uint8_t>(quote_rule)];
		for (const auto &quote : quote_candidates) {
			for (const auto &delimiter : default_delimiter) {
				const auto &escape_candidates = default_escape[static_cast<uint8_t>(quote_rule)];
				for (const auto &escape : escape_candidates) {
					for (const auto &comment : default_comment) {
						for (const bool strict_mode : {true, false}) {
							Insert({delimiter, quote, escape, comment, NewLineIdentifier::SINGLE_N, strict_mode});
							Insert({delimiter, quote, escape, comment, NewLineIdentifier::SINGLE_R, strict_mode});
							Insert({delimiter, quote, escape, comment, NewLineIdentifier::CARRY_ON, strict_mode});
						}
					}
				}
			}
		}
	}
}